

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

void __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Polynom
          (Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *this,Numeral *numeral,
          PolyNf *term)

{
  Monom *in_RDX;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_RSI;
  RationalConstantType *in_RDI;
  PolyNf *in_stack_ffffffffffffff28;
  RationalConstantType *in_stack_ffffffffffffff40;
  Numeral *in_stack_ffffffffffffff48;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff50;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff68;
  PolyNf *in_stack_ffffffffffffff98;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffffa0;
  
  RationalConstantType::RationalConstantType(in_stack_ffffffffffffff40,&in_RDX->numeral);
  PolyNf::PolyNf((PolyNf *)in_RDI,in_stack_ffffffffffffff28);
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::MonomFactors
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Lib::
  perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>
            (in_stack_ffffffffffffff68);
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
              *)in_stack_ffffffffffffff40);
  Polynom(in_RSI,in_RDX);
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Monom
            ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x45ee28);
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::~MonomFactors
            ((MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x45ee32);
  RationalConstantType::~RationalConstantType(in_RDI);
  return;
}

Assistant:

Polynom<Number>::Polynom(Numeral numeral, PolyNf term) 
  : Polynom(Monom(numeral, perfect(MonomFactors(term))))
{  }